

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy.cpp
# Opt level: O1

void __thiscall NaDummyFunc::NaDummyFunc(NaDummyFunc *this,char *szOptions,NaVector *vInit)

{
  uint uVar1;
  undefined8 *puVar2;
  int i;
  uint uVar3;
  
  NaExternFunc::NaExternFunc(&this->super_NaExternFunc);
  *(undefined ***)this = &PTR_PrintLog_00103d30;
  NaPrintLog("dummy: options=\'%s\'\n",szOptions);
  uVar3 = 0;
  NaPrintLog("dummy: initial:");
  while( true ) {
    uVar1 = (**(code **)(*(long *)vInit + 0x30))(vInit);
    if (uVar1 <= uVar3) break;
    puVar2 = (undefined8 *)(**(code **)(*(long *)vInit + 0x40))(vInit,uVar3);
    NaPrintLog(" %g",*puVar2);
    uVar3 = uVar3 + 1;
  }
  NaPrintLog("\n");
  NaUnit::Assign((uint)this,2,3);
  uVar3 = (**(code **)(*(long *)this + 0x48))(this);
  uVar1 = (**(code **)(*(long *)this + 0x50))(this);
  NaPrintLog("dummy: dim in=%u out=%u\n",(ulong)uVar3,(ulong)uVar1);
  return;
}

Assistant:

NaDummyFunc::NaDummyFunc (char* szOptions,
			  NaVector& vInit)
{
    NaPrintLog("dummy: options='%s'\n", szOptions);
    NaPrintLog("dummy: initial:");
    for(int i = 0; i < vInit.dim(); ++i) {
	NaPrintLog(" %g", vInit[i]);
    }
    NaPrintLog("\n");

    Assign(2, 3);
    NaPrintLog("dummy: dim in=%u out=%u\n", InputDim(), OutputDim());
}